

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Node * prvTidyParseHead(TidyDocImpl *doc,Node *head,GetTokenMode mode)

{
  TidyParserMemory *pTVar1;
  Lexer *pLVar2;
  Dict *pDVar3;
  TidyParserMemory data;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Bool BVar7;
  int iVar8;
  long lVar9;
  Node *node;
  Node *pNVar10;
  Node **ppNVar11;
  uint uVar12;
  uint uVar13;
  TidyParserMemory memory;
  long local_48;
  
  uVar13 = 0;
  uVar12 = 0;
  if (head == (Node *)0x0) {
    iVar8 = (doc->stack).top;
    lVar9 = (long)iVar8;
    if (lVar9 < 0) {
      head = (Node *)0x0;
      uVar13 = 0;
      uVar12 = 0;
    }
    else {
      pTVar1 = (doc->stack).content;
      head = pTVar1[lVar9].original_node;
      uVar13 = pTVar1[lVar9].register_1;
      uVar12 = pTVar1[lVar9].register_2;
      (doc->stack).top = iVar8 + -1;
    }
  }
  pLVar2 = doc->lexer;
  node = prvTidyGetToken(doc,IgnoreWhitespace);
  do {
    if (node == (Node *)0x0) {
      return (Node *)0x0;
    }
    pDVar3 = node->tag;
    if (pDVar3 == head->tag) {
      if (node->type == EndTag) {
        prvTidyFreeNode(doc,node);
        head->closed = yes;
        return (Node *)0x0;
      }
      if (pDVar3 != head->tag) goto LAB_0013afd1;
LAB_0013afdb:
      if (node->type != StartTag) goto LAB_0013afe2;
      goto LAB_0013b05b;
    }
LAB_0013afd1:
    if ((pDVar3 != (Dict *)0x0) && (pDVar3->id == TidyTag_HTML)) goto LAB_0013afdb;
LAB_0013afe2:
    BVar7 = prvTidynodeIsText(node);
    if (BVar7 != no) {
      if ((*(int *)((doc->config).value + 0x3b) != 0) || (*(int *)((doc->config).value + 6) == 1))
      goto LAB_0013b0e4;
LAB_0013b0cf:
      prvTidyReport(doc,head,node,0x27e);
LAB_0013b0e4:
      prvTidyUngetToken(doc);
      return (Node *)0x0;
    }
    if ((node->type == ProcInsTag) &&
       ((node->element != (ctmbstr)0x0 &&
        (iVar8 = prvTidytmbstrcmp(node->element,"xml-stylesheet"), iVar8 == 0)))) {
      prvTidyReport(doc,head,node,0x27e);
      pNVar10 = prvTidyFindHTML(doc);
      prvTidyInsertNodeBeforeElement(pNVar10,node);
    }
    else {
      BVar7 = InsertMisc(head,node);
      if (BVar7 == no) {
        if (node->type == DocTypeTag) {
          InsertDocType(doc,head,node);
        }
        else {
          if (node->tag != (Dict *)0x0) {
            if ((node->tag->model & 4) == 0) {
              if (pLVar2->isvoyager == no) goto LAB_0013b0e4;
              goto LAB_0013b0cf;
            }
            BVar7 = prvTidynodeIsElement(node);
            if (BVar7 == no) goto LAB_0013b05b;
            pDVar3 = node->tag;
            if (pDVar3 != (Dict *)0x0) {
              if (pDVar3->id == TidyTag_TITLE) {
                uVar5 = uVar12;
                uVar6 = uVar13 + 1;
                uVar4 = uVar13;
              }
              else {
                if ((pDVar3 == (Dict *)0x0) || (pDVar3->id != TidyTag_BASE)) goto LAB_0013b17a;
                uVar5 = uVar12 + 1;
                uVar6 = uVar13;
                uVar4 = uVar12;
              }
              uVar13 = uVar6;
              uVar12 = uVar5;
              if (0 < (int)uVar4) {
                prvTidyReport(doc,head,node,(head == (Node *)0x0) + 0x27f);
              }
            }
LAB_0013b17a:
            node->parent = head;
            if (head == (Node *)0x0) {
              node->prev = (Node *)0x0;
LAB_0013b19d:
              if (head == (Node *)0x0) goto LAB_0013b1b2;
              ppNVar11 = &head->content;
            }
            else {
              pNVar10 = head->last;
              node->prev = pNVar10;
              if (pNVar10 == (Node *)0x0) goto LAB_0013b19d;
              ppNVar11 = &pNVar10->next;
            }
            *ppNVar11 = node;
            if (head != (Node *)0x0) {
              head->last = node;
            }
LAB_0013b1b2:
            local_48 = (ulong)uVar13 << 0x20;
            data.original_node = head;
            data.identity = prvTidyParseHead;
            data.reentry_node = node;
            data.reentry_mode = IgnoreWhitespace;
            data.reentry_state = 0;
            data.mode = (undefined4)local_48;
            data.register_1 = local_48._4_4_;
            data.register_2 = uVar12;
            data._44_4_ = 0;
            prvTidypushMemory(doc,data);
            return node;
          }
LAB_0013b05b:
          prvTidyReport(doc,head,node,0x235);
          prvTidyFreeNode(doc,node);
        }
      }
    }
    node = prvTidyGetToken(doc,IgnoreWhitespace);
  } while( true );
}

Assistant:

Node* TY_(ParseHead)( TidyDocImpl* doc, Node *head, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node;
    int HasTitle = 0;
    int HasBase = 0;
    DEBUG_LOG_COUNTERS;

    if ( head == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        head = memory.original_node;
        HasTitle = memory.register_1;
        HasBase = memory.register_2;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(head);
    }
    
    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == head->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            head->closed = yes;
            break;
        }

        /* find and discard multiple <head> elements */
        /* find and discard <html> in <head> elements */
        if ((node->tag == head->tag || nodeIsHTML(node)) && node->type == StartTag)
        {
            TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)(doc, node);
            continue;
        }

        if (TY_(nodeIsText)(node))
        {
            /*\ Issue #132 - avoid warning for missing body tag,
             *  if configured to --omit-otpional-tags yes
             *  Issue #314 - and if --show-body-only
            \*/
            if (!cfgBool( doc, TidyOmitOptionalTags ) &&
                !showingBodyOnly(doc) )
            {
                TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN);
            }
            TY_(UngetToken)( doc );
            break;
        }

        if (node->type == ProcInsTag && node->element &&
            TY_(tmbstrcmp)(node->element, "xml-stylesheet") == 0)
        {
            TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN);
            TY_(InsertNodeBeforeElement)(TY_(FindHTML)(doc), node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(head, node))
            continue;

        if (node->type == DocTypeTag)
        {
            InsertDocType(doc, head, node);
            continue;
        }

        /* discard unknown tags */
        if (node->tag == NULL)
        {
            TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /*
         if it doesn't belong in the head then
         treat as implicit end of head and deal
         with as part of the body
        */
        if (!(node->tag->model & CM_HEAD))
        {
            /* #545067 Implicit closing of head broken - warn only for XHTML input */
            if ( lexer->isvoyager )
                TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN );
            TY_(UngetToken)( doc );
            break;
        }

        if (TY_(nodeIsElement)(node))
        {
            if ( nodeIsTITLE(node) )
            {
                ++HasTitle;

                if (HasTitle > 1)
                    TY_(Report)(doc, head, node,
                                     head ?
                                     TOO_MANY_ELEMENTS_IN : TOO_MANY_ELEMENTS);
            }
            else if ( nodeIsBASE(node) )
            {
                ++HasBase;

                if (HasBase > 1)
                    TY_(Report)(doc, head, node,
                                     head ?
                                     TOO_MANY_ELEMENTS_IN : TOO_MANY_ELEMENTS);
            }

            TY_(InsertNodeAtEnd)(head, node);

            {
                TidyParserMemory memory = {0};
                memory.identity = TY_(ParseHead);
                memory.original_node = head;
                memory.reentry_node = node;
                memory.register_1 = HasTitle;
                memory.register_2 = HasBase;
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            }
        }

        /* discard unexpected text nodes and end tags */
        TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }
    DEBUG_LOG_EXIT;
    return NULL;
}